

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_int8.h
# Opt level: O0

void ncnn::conv3x3s1_winograd23_transform_kernel_int8_sse
               (Mat *kernel,Mat *kernel_tm,int inch,int outch)

{
  int in_ECX;
  long lVar1;
  int in_EDX;
  Mat *in_RDI;
  int i_1;
  short *tmpp;
  int j;
  int i;
  short tmp [4] [3];
  char *k2;
  char *k1;
  char *k0;
  short *kernel_tm0;
  char *kernel0;
  int q;
  int p;
  short ktm [4] [3];
  Allocator *in_stack_ffffffffffffff00;
  Mat *this;
  Mat *in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff14;
  int iVar2;
  undefined8 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  int iVar3;
  short local_d8 [16];
  char *local_b8;
  char *local_b0;
  char *local_a8;
  Mat local_90;
  Mat *local_50;
  char *local_48;
  int local_40;
  int local_3c;
  short local_38 [16];
  int local_18;
  int local_14;
  Mat *local_8;
  
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_8 = in_RDI;
  Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
              (int)((ulong)in_stack_ffffffffffffff18 >> 0x20),(int)in_stack_ffffffffffffff18,
              in_stack_ffffffffffffff14,(size_t)in_stack_ffffffffffffff08,in_stack_ffffffffffffff00)
  ;
  local_38[0] = 2;
  local_38[1] = 0;
  local_38[2] = 0;
  local_38[3] = 1;
  local_38[4] = 1;
  local_38[5] = 1;
  local_38[6] = 1;
  local_38[7] = -1;
  local_38[8] = 1;
  local_38[9] = 0;
  local_38[10] = 0;
  local_38[0xb] = 2;
  for (local_3c = 0; local_3c < local_18; local_3c = local_3c + 1) {
    for (local_40 = 0; local_40 < local_14; local_40 = local_40 + 1) {
      local_48 = Mat::operator_cast_to_signed_char_(local_8);
      local_48 = local_48 + (long)(local_40 * 9) + (long)(local_3c * local_14 * 9);
      this = &local_90;
      Mat::channel(in_stack_ffffffffffffff08,(int)((ulong)this >> 0x20));
      in_stack_ffffffffffffff08 = (Mat *)Mat::row<short>(this,local_40);
      Mat::~Mat((Mat *)0x1521de);
      local_a8 = local_48;
      local_b0 = local_48 + 3;
      local_b8 = local_48 + 6;
      local_50 = in_stack_ffffffffffffff08;
      for (iVar3 = 0; iVar3 < 4; iVar3 = iVar3 + 1) {
        local_d8[(long)iVar3 * 3] =
             (short)*local_a8 * local_38[(long)iVar3 * 3] +
             (short)local_a8[1] * local_38[(long)iVar3 * 3 + 1] +
             (short)local_a8[2] * local_38[(long)iVar3 * 3 + 2];
        local_d8[(long)iVar3 * 3 + 1] =
             (short)*local_b0 * local_38[(long)iVar3 * 3] +
             (short)local_b0[1] * local_38[(long)iVar3 * 3 + 1] +
             (short)local_b0[2] * local_38[(long)iVar3 * 3 + 2];
        local_d8[(long)iVar3 * 3 + 2] =
             (short)*local_b8 * local_38[(long)iVar3 * 3] +
             (short)local_b8[1] * local_38[(long)iVar3 * 3 + 1] +
             (short)local_b8[2] * local_38[(long)iVar3 * 3 + 2];
      }
      for (iVar3 = 0; iVar3 < 4; iVar3 = iVar3 + 1) {
        lVar1 = (long)iVar3;
        for (iVar2 = 0; iVar2 < 4; iVar2 = iVar2 + 1) {
          *(short *)((long)&local_50->data + (long)(iVar3 * 4 + iVar2) * 2) =
               local_d8[lVar1 * 3] * local_38[(long)iVar2 * 3] +
               local_d8[lVar1 * 3 + 1] * local_38[(long)iVar2 * 3 + 1] +
               local_d8[lVar1 * 3 + 2] * local_38[(long)iVar2 * 3 + 2];
        }
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd23_transform_kernel_int8_sse(const Mat& kernel, Mat& kernel_tm, int inch, int outch)
{
    kernel_tm.create(4*4, inch, outch, 2ul);  

    // G
    const short ktm[4][3] = {
        {   2,     0,     0},
        {   1,     1,     1},
        {   1,    -1,     1},
        {   0,     0,     2}
    };

    #pragma omp parallel for
    for (int p = 0; p<outch; p++)
    {
        for (int q = 0; q<inch; q++)
        {
            const signed char* kernel0 = (const signed char*)kernel + p*inch * 9 + q * 9;
            short* kernel_tm0 = kernel_tm.channel(p).row<short>(q);

            // transform kernel
            const signed char* k0 = kernel0;
            const signed char* k1 = kernel0 + 3;
            const signed char* k2 = kernel0 + 6;

            // h
            short tmp[4][3];
            for (int i=0; i<4; i++)
            {
                tmp[i][0] = (short)k0[0] * ktm[i][0] + k0[1] * ktm[i][1] + k0[2] * ktm[i][2];
                tmp[i][1] = (short)k1[0] * ktm[i][0] + k1[1] * ktm[i][1] + k1[2] * ktm[i][2];
                tmp[i][2] = (short)k2[0] * ktm[i][0] + k2[1] * ktm[i][1] + k2[2] * ktm[i][2];
            }

            // U
            for (int j=0; j<4; j++)
            {
                short* tmpp = &tmp[j][0];

                for (int i=0; i<4; i++)
                {
                    kernel_tm0[j*4 + i] = tmpp[0] * ktm[i][0] + tmpp[1] * ktm[i][1] + tmpp[2] * ktm[i][2];
                }
            }
        }
    }
}